

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O0

QUuid QUuid::fromString(QAnyStringView text)

{
  long lVar1;
  long in_FS_OFFSET;
  QUuid QVar2;
  anon_class_1_0_00000001 *unaff_retaddr;
  QAnyStringView *in_stack_00000008;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = QAnyStringView::visit<QUuid::fromString(QAnyStringView)::__0>
                    (in_stack_00000008,unaff_retaddr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QUuid QUuid::fromString(QAnyStringView text) noexcept
{
    return text.visit([] (auto text) { return uuidFromString(text); });
}